

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libntlmconnect.c
# Opt level: O0

size_t callback(char *ptr,size_t size,size_t nmemb,void *data)

{
  undefined8 uVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  size_t failure;
  long lStack_48;
  CURLcode code;
  long longdata;
  long lStack_38;
  curl_socket_t sock;
  ssize_t idx;
  void *data_local;
  size_t nmemb_local;
  size_t size_local;
  char *ptr_local;
  
  lStack_38 = (long)data + -0x106110 >> 3;
  pcVar3 = (char *)(long)(int)(uint)(size == 0 || nmemb == 0);
  counter[lStack_38] = (int)size * (int)nmemb + counter[lStack_38];
  idx = (ssize_t)data;
  data_local = (void *)nmemb;
  nmemb_local = size;
  size_local = (size_t)ptr;
  iVar2 = curl_easy_getinfo(easy[lStack_38],0x20001d,&stack0xffffffffffffffb8);
  uVar1 = _stderr;
  if (iVar2 == 0) {
    if (lStack_48 == -1) {
      longdata._4_4_ = -1;
    }
    else {
      longdata._4_4_ = (int)lStack_48;
    }
    if (longdata._4_4_ != -1) {
      if (sockets[lStack_38] == -1) {
        sockets[lStack_38] = longdata._4_4_;
      }
      else if (longdata._4_4_ != sockets[lStack_38]) {
        iVar2 = curlx_sztosi(lStack_38);
        curl_mfprintf(uVar1,"Handle %d started on socket %d and moved to %d\n",iVar2,
                      sockets[lStack_38],longdata._4_4_);
        res = 0x7e;
        return (size_t)pcVar3;
      }
    }
    ptr_local = (char *)(nmemb_local * (long)data_local);
  }
  else {
    uVar4 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_easy_getinfo() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/libntlmconnect.c"
                  ,0x37,iVar2,uVar4);
    res = 0x7e;
    ptr_local = pcVar3;
  }
  return (size_t)ptr_local;
}

Assistant:

static size_t callback(char *ptr, size_t size, size_t nmemb, void *data)
{
  ssize_t idx = ((CURL **) data) - easy;
  curl_socket_t sock;
  long longdata;
  CURLcode code;
  const size_t failure = (size && nmemb) ? 0 : 1;
  (void)ptr;

  counter[idx] += (int)(size * nmemb);

  /* Get socket being used for this easy handle, otherwise CURL_SOCKET_BAD */
  code = curl_easy_getinfo(easy[idx], CURLINFO_LASTSOCKET, &longdata);
  if(CURLE_OK != code) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed, "
            "with code %d (%s)\n",
            __FILE__, __LINE__, (int)code, curl_easy_strerror(code));
    res = TEST_ERR_MAJOR_BAD;
    return failure;
  }
  if(longdata == -1L)
    sock = CURL_SOCKET_BAD;
  else
    sock = (curl_socket_t)longdata;

  if(sock != CURL_SOCKET_BAD) {
    /* Track relationship between this easy handle and the socket. */
    if(sockets[idx] == CURL_SOCKET_BAD) {
      /* An easy handle without previous socket, record the socket. */
      sockets[idx] = sock;
    }
    else if(sock != sockets[idx]) {
      /* An easy handle with a socket different to previously
         tracked one, log and fail right away. Known bug #37. */
      fprintf(stderr, "Handle %d started on socket %d and moved to %d\n",
              curlx_sztosi(idx), (int)sockets[idx], (int)sock);
      res = TEST_ERR_MAJOR_BAD;
      return failure;
    }
  }
  return size * nmemb;
}